

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Platform.h
# Opt level: O2

bool senjo::ParamValue(string *value,char **params,string *next)

{
  char *pcVar1;
  size_type sVar2;
  int iVar3;
  char *in_RAX;
  char *pcVar4;
  char *pcVar5;
  size_t sVar6;
  char **ppcVar7;
  char *local_38;
  
  if ((*params != (char *)0x0) && (local_38 = in_RAX, pcVar4 = NextWord(params), *pcVar4 != '\0')) {
    pcVar4 = (next->_M_dataplus)._M_p;
    sVar2 = next->_M_string_length;
    ppcVar7 = params;
    if (sVar2 != 0) goto LAB_0012e8a3;
    pcVar5 = (char *)0x0;
    while (local_38 = pcVar5, pcVar5 != (char *)0x0) {
      if ((pcVar5[sVar2] == '\0') || (iVar3 = isspace((int)pcVar5[sVar2]), iVar3 != 0)) {
        pcVar4 = *params;
        goto LAB_0012e901;
      }
      local_38 = pcVar5 + sVar2;
      NextSpace(&local_38);
      ppcVar7 = &local_38;
LAB_0012e8a3:
      pcVar5 = strstr(*ppcVar7,pcVar4);
    }
    pcVar4 = *params;
    sVar6 = strlen(pcVar4);
    pcVar5 = pcVar4 + sVar6;
    local_38 = pcVar5;
LAB_0012e901:
    do {
      if (pcVar5 <= pcVar4) break;
      pcVar1 = pcVar5 + -1;
      pcVar5 = pcVar5 + -1;
      iVar3 = isspace((int)*pcVar1);
    } while (iVar3 != 0);
    std::__cxx11::string::assign((char *)value,(ulong)pcVar4);
    if (value->_M_string_length != 0) {
      *params = *params + value->_M_string_length;
      NextWord(params);
      return true;
    }
  }
  return false;
}

Assistant:

static inline bool ParamValue(std::string& value, const char*& params,
                              const std::string& next)
{
  if (params && *NextWord(params)) {
    const char* end = next.size() ? strstr(params, next.c_str()) : NULL;
    while (end && end[next.size()] && !isspace(end[next.size()])) {
      NextSpace(end += next.size());
      end = strstr(end, next.c_str());
    }
    if (!end) {
      end = (params + strlen(params));
    }
    while ((end > params) && isspace(end[-1])) {
      --end;
    }
    value.assign(params, (end - params));
    if (value.size()) {
      NextWord(params += value.size());
      return true;
    }
  }
  return false;
}